

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::
Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_1,_false>
::Block(Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>
        *this,Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true> *xpr,Index startRow
       ,Index startCol,Index blockRows,Index blockCols)

{
  internal::
  BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_1,_false,_true>
  ::BlockImpl_dense((BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
                     *)this,xpr,startRow,startCol,blockRows,blockCols);
  if (blockCols != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  if ((((-1 < (blockRows | startRow)) && (-1 < startCol)) &&
      (startRow <=
       (xpr->
       super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
       m_rows.m_value - blockRows)) &&
     (startCol <
      (xpr->
      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
      m_cols.m_value)) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }